

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.hpp
# Opt level: O3

string * Log::FormatTime_abi_cxx11_(void)

{
  tm *ptVar1;
  string *in_RDI;
  time_t t;
  char buf [100];
  
  time(&t);
  ptVar1 = localtime(&t);
  sprintf(buf,"%04d-%02d-%02d %02d:%02d:%02d",(ulong)(ptVar1->tm_year + 0x76c),
          (ulong)(ptVar1->tm_mon + 1),(ulong)(uint)ptVar1->tm_mday,(ulong)(uint)ptVar1->tm_hour,
          (ulong)(uint)ptVar1->tm_min,(ulong)(uint)ptVar1->tm_sec);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  strlen(buf);
  std::__cxx11::string::_M_construct<char_const*>();
  return in_RDI;
}

Assistant:

static std::string FormatTime()
    {
        time_t t;
        struct tm *tm = NULL;

        time(&t);
        tm = localtime(&t);
        char buf[100];
        sprintf(buf, "%04d-%02d-%02d %02d:%02d:%02d",
                tm->tm_year + 1900, tm->tm_mon + 1, tm->tm_mday,
                tm->tm_hour, tm->tm_min, tm->tm_sec);
        return std::string(buf);
    }